

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImU32 ImHash(void *data,int data_size,ImU32 seed)

{
  byte bVar1;
  ImU32 i;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  if (ImHash::crc32_lut[1] == 0) {
    for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
      iVar8 = 8;
      uVar7 = uVar3 & 0xffffffff;
      while( true ) {
        bVar9 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        if (bVar9) break;
        uVar7 = (ulong)(-((uint)uVar7 & 1) & 0xedb88320 ^ (uint)(uVar7 >> 1));
      }
      ImHash::crc32_lut[uVar3] = (uint)uVar7;
    }
  }
  uVar4 = ~seed;
  if (data_size < 1) {
    uVar2 = uVar4;
    for (pcVar6 = (char *)((long)data + 2); bVar1 = pcVar6[-2], bVar1 != 0; pcVar6 = pcVar6 + 1) {
      if (((bVar1 == 0x23) && (pcVar6[-1] == '#')) && (*pcVar6 == '#')) {
        uVar2 = uVar4;
      }
      uVar2 = uVar2 >> 8 ^ ImHash::crc32_lut[uVar2 & 0xff ^ (uint)bVar1];
    }
  }
  else {
    for (lVar5 = 0; uVar2 = uVar4, data_size != (int)lVar5; lVar5 = lVar5 + 1) {
      uVar4 = uVar4 >> 8 ^ ImHash::crc32_lut[(uint)*(byte *)((long)data + lVar5) ^ uVar4 & 0xff];
    }
  }
  return ~uVar2;
}

Assistant:

ImU32 ImHash(const void* data, int data_size, ImU32 seed)
{
    static ImU32 crc32_lut[256] = { 0 };
    if (!crc32_lut[1])
    {
        const ImU32 polynomial = 0xEDB88320;
        for (ImU32 i = 0; i < 256; i++)
        {
            ImU32 crc = i;
            for (ImU32 j = 0; j < 8; j++)
                crc = (crc >> 1) ^ (ImU32(-int(crc & 1)) & polynomial);
            crc32_lut[i] = crc;
        }
    }

    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* current = (const unsigned char*)data;

    if (data_size > 0)
    {
        // Known size
        while (data_size--)
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *current++];
    }
    else
    {
        // Zero-terminated string
        while (unsigned char c = *current++)
        {
            // We support a syntax of "label###id" where only "###id" is included in the hash, and only "label" gets displayed.
            // Because this syntax is rarely used we are optimizing for the common case.
            // - If we reach ### in the string we discard the hash so far and reset to the seed.
            // - We don't do 'current += 2; continue;' after handling ### to keep the code smaller.
            if (c == '#' && current[0] == '#' && current[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}